

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsUniformBlockCase.cpp
# Opt level: O0

ostream * deqp::gls::ub::operator<<(ostream *str,LayoutFlagsFmt *fmt)

{
  int local_20;
  uint local_1c;
  int descNdx;
  deUint32 remBits;
  LayoutFlagsFmt *fmt_local;
  ostream *str_local;
  
  local_1c = fmt->flags;
  for (local_20 = 0; local_20 < 5; local_20 = local_20 + 1) {
    if ((local_1c & operator<<::bitDesc[local_20].bit) != 0) {
      if (local_1c != fmt->flags) {
        std::operator<<(str,", ");
      }
      std::operator<<(str,operator<<::bitDesc[local_20].token);
      local_1c = (operator<<::bitDesc[local_20].bit ^ 0xffffffff) & local_1c;
    }
  }
  return str;
}

Assistant:

std::ostream& operator<< (std::ostream& str, const LayoutFlagsFmt& fmt)
{
	static const struct
	{
		deUint32	bit;
		const char*	token;
	} bitDesc[] =
	{
		{ LAYOUT_SHARED,		"shared"		},
		{ LAYOUT_PACKED,		"packed"		},
		{ LAYOUT_STD140,		"std140"		},
		{ LAYOUT_ROW_MAJOR,		"row_major"		},
		{ LAYOUT_COLUMN_MAJOR,	"column_major"	}
	};

	deUint32 remBits = fmt.flags;
	for (int descNdx = 0; descNdx < DE_LENGTH_OF_ARRAY(bitDesc); descNdx++)
	{
		if (remBits & bitDesc[descNdx].bit)
		{
			if (remBits != fmt.flags)
				str << ", ";
			str << bitDesc[descNdx].token;
			remBits &= ~bitDesc[descNdx].bit;
		}
	}
	DE_ASSERT(remBits == 0);
	return str;
}